

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-utf8.cc
# Opt level: O1

void anon_unknown.dwarf_103821::assert_is_valid_utf8
               (bool expected,int length,int cu0,int cu1,int cu2,int cu3)

{
  bool bVar1;
  size_t s_length;
  undefined4 in_register_0000008c;
  char buf [4];
  AssertionResult gtest_ar_;
  char local_7c;
  undefined1 local_7b;
  undefined1 local_7a;
  undefined1 local_79;
  int local_78;
  int local_74;
  internal local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  AssertHelper local_58;
  string local_50;
  
  local_7c = (char)cu0;
  local_7b = (undefined1)cu1;
  local_7a = (undefined1)cu2;
  local_79 = (undefined1)cu3;
  local_78 = cu2;
  local_74 = cu3;
  if (1 < length && expected) {
    s_length = 1;
    do {
      bVar1 = wabt::IsValidUtf8(&local_7c,s_length);
      local_70[0] = (internal)!bVar1;
      local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_70[0]) {
        testing::Message::Message((Message *)&local_60);
        std::ostream::operator<<((ostream *)(local_60._M_head_impl + 0x10),cu0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_60._M_head_impl + 0x10),", ",2);
        std::ostream::operator<<((ostream *)(local_60._M_head_impl + 0x10),cu1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_60._M_head_impl + 0x10),", ",2);
        std::ostream::operator<<((ostream *)(local_60._M_head_impl + 0x10),local_78);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_60._M_head_impl + 0x10),", ",2);
        std::ostream::operator<<((ostream *)(local_60._M_head_impl + 0x10),local_74);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_50,local_70,(AssertionResult *)"IsValidUtf8(buf, bad_length)","true",
                   "false",(char *)CONCAT44(in_register_0000008c,cu3));
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-utf8.cc"
                   ,0x26,local_50._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
        goto LAB_0015fcf9;
      }
      s_length = s_length + 1;
    } while ((uint)length != s_length);
  }
  bVar1 = wabt::IsValidUtf8(&local_7c,(ulong)(uint)length);
  local_70[0] = (internal)(bVar1 == expected);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_70[0]) {
    testing::Message::Message((Message *)&local_60);
    std::ostream::operator<<((ostream *)(local_60._M_head_impl + 0x10),cu0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_60._M_head_impl + 0x10),", ",2);
    std::ostream::operator<<((ostream *)(local_60._M_head_impl + 0x10),cu1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_60._M_head_impl + 0x10),", ",2);
    std::ostream::operator<<((ostream *)(local_60._M_head_impl + 0x10),local_78);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_60._M_head_impl + 0x10),", ",2);
    std::ostream::operator<<((ostream *)(local_60._M_head_impl + 0x10),local_74);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_50,local_70,(AssertionResult *)"expected == IsValidUtf8(buf, length)","false",
               "true",(char *)CONCAT44(in_register_0000008c,cu3));
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-utf8.cc"
               ,0x2b,local_50._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
LAB_0015fcf9:
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  return;
}

Assistant:

void assert_is_valid_utf8(bool expected,
                          int length,
                          int cu0 = 0,
                          int cu1 = 0,
                          int cu2 = 0,
                          int cu3 = 0) {
  assert(length <= 4);
  char buf[4] = {static_cast<char>(cu0), static_cast<char>(cu1),
                 static_cast<char>(cu2), static_cast<char>(cu3)};
  if (expected) {
    // Make sure it fails if there are continuation bytes past the end of the
    // string.
    for (int bad_length = 1; bad_length < length; ++bad_length) {
      ASSERT_FALSE(IsValidUtf8(buf, bad_length))
          << cu0 << ", " << cu1 << ", " << cu2 << ", " << cu3;
    }
  }

  ASSERT_TRUE(expected == IsValidUtf8(buf, length))
      << cu0 << ", " << cu1 << ", " << cu2 << ", " << cu3;
}